

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::RemoveCharsButUpperHex(char *str)

{
  size_t sVar1;
  char *local_28;
  char *ptr;
  char *clean_str;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    str_local = (char *)operator_new__(sVar1 + 1);
    local_28 = str_local;
    for (clean_str = str; *clean_str != '\0'; clean_str = clean_str + 1) {
      if ((('/' < *clean_str) && (*clean_str < ':')) || (('@' < *clean_str && (*clean_str < 'G'))))
      {
        *local_28 = *clean_str;
        local_28 = local_28 + 1;
      }
    }
    *local_28 = '\0';
  }
  return str_local;
}

Assistant:

char* SystemTools::RemoveCharsButUpperHex(const char* str)
{
  if (!str) {
    return nullptr;
  }
  char* clean_str = new char[strlen(str) + 1];
  char* ptr = clean_str;
  while (*str) {
    if ((*str >= '0' && *str <= '9') || (*str >= 'A' && *str <= 'F')) {
      *ptr++ = *str;
    }
    ++str;
  }
  *ptr = '\0';
  return clean_str;
}